

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

int __thiscall
baryonyx::itm::compute_order::
local_compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
          (compute_order *this,
          solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
          *slv,bit_array *x)

{
  bool bVar1;
  int local_28;
  int local_24;
  int k;
  int remaining;
  bit_array *x_local;
  solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  *slv_local;
  compute_order *this_local;
  
  local_24 = 0;
  for (local_28 = 0; local_28 != slv->m; local_28 = local_28 + 1) {
    bVar1 = is_valid_constraint<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
                      (slv,local_28,x);
    if (!bVar1) {
      local_24 = local_24 + 1;
    }
  }
  return local_24;
}

Assistant:

int local_compute_violated_constraints(const Solver& slv, const Xtype& x)
    {
        int remaining = 0;
        for (int k = 0; k != slv.m; ++k)
            if (!is_valid_constraint(slv, k, x))
                ++remaining;

        return remaining;
    }